

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

int32_t container_write(container_t *c,uint8_t typecode,char *buf)

{
  array_container_t *in_RDX;
  uint8_t in_SIL;
  container_t *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  uint8_t local_11;
  container_t *local_10;
  int32_t local_4;
  
  local_11 = in_SIL;
  local_10 = container_unwrap_shared(in_RDI,&local_11);
  if (local_11 == '\x01') {
    local_4 = bitset_container_write
                        ((bitset_container_t *)in_RDX,
                         (char *)(ulong)CONCAT14(1,in_stack_ffffffffffffffd8));
  }
  else if (local_11 == '\x02') {
    local_4 = array_container_write(in_RDX,(char *)(ulong)CONCAT14(2,in_stack_ffffffffffffffd8));
  }
  else {
    local_4 = run_container_write((run_container_t *)in_RDX,
                                  (char *)(ulong)CONCAT14(local_11,in_stack_ffffffffffffffd8));
  }
  return local_4;
}

Assistant:

static inline int32_t container_write(const container_t *c, uint8_t typecode,
                                      char *buf) {
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_write(const_CAST_bitset(c), buf);
        case ARRAY_CONTAINER_TYPE:
            return array_container_write(const_CAST_array(c), buf);
        case RUN_CONTAINER_TYPE:
            return run_container_write(const_CAST_run(c), buf);
    }
    assert(false);
    roaring_unreachable;
    return 0;  // unreached
}